

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O2

AVisitor<hiberlite::ExtractModel> * __thiscall
hiberlite::AVisitor<hiberlite::ExtractModel>::operator&
          (AVisitor<hiberlite::ExtractModel> *this,
          collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
          *nvp)

{
  ExtractModel *this_00;
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  cStack_58;
  
  this_00 = this->actor;
  collection_nvp<std::pair<int,_double>,_hiberlite::stl_stream_adapter<std::pair<int,_double>,_std::set<std::pair<int,_double>,_std::less<std::pair<int,_double>_>,_std::allocator<std::pair<int,_double>_>_>_>_>
  ::collection_nvp(&cStack_58,nvp);
  ExtractModel::
  act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::pair<int,double>,hiberlite::stl_stream_adapter<std::pair<int,double>,std::set<std::pair<int,double>,std::less<std::pair<int,double>>,std::allocator<std::pair<int,double>>>>>
            (this_00,this,&cStack_58);
  std::__cxx11::string::~string((string *)&cStack_58);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(collection_nvp<E,S> nvp)
{
	actor->act(*this,nvp);
	return *this;
}